

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O3

int io_file_read(lua_State *L,FILE *fp,int start)

{
  byte bVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  GCstr *pGVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  MSize MVar14;
  ulong uVar15;
  bool bVar16;
  TValue local_38;
  
  pTVar2 = L->top;
  pTVar3 = L->base;
  clearerr((FILE *)fp);
  iVar11 = (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 3) - start;
  if (iVar11 == 0) {
    uVar4 = io_file_readline(L,fp,1);
    uVar15 = (ulong)(start + 1);
  }
  else {
    luaL_checkstack(L,iVar11 + 0x14,"too many arguments");
    uVar15 = (ulong)start;
    uVar4 = 1;
    do {
      uVar13 = *(uint *)((long)L->base + uVar15 * 8 + 4);
      iVar5 = (int)uVar15;
      if (uVar13 == 0xfffffffb) {
        uVar7 = (ulong)L->base[uVar15].u32.lo;
        if (*(char *)(uVar7 + 0x10) != '*') {
LAB_00145fc7:
          lj_err_arg(L,iVar5 + 1,LJ_ERR_INVOPT);
        }
        bVar1 = *(byte *)(uVar7 + 0x11);
        if (bVar1 == 0x6e) {
          iVar5 = __isoc99_fscanf(fp,"%lf",&local_38);
          if (iVar5 == 1) {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            *pTVar2 = local_38;
            uVar4 = 1;
          }
          else {
            pTVar2 = L->top;
            L->top = pTVar2 + 1;
            (pTVar2->field_2).it = 0xffffffff;
            uVar4 = 0;
          }
        }
        else if ((bVar1 & 0xdf) == 0x4c) {
          uVar4 = io_file_readline(L,fp,(uint)(bVar1 == 0x6c));
        }
        else {
          if (bVar1 != 0x61) {
            lj_err_arg(L,iVar5 + 1,LJ_ERR_INVFMT);
          }
          uVar7 = 0;
          uVar13 = 0x2000;
          do {
            uVar12 = (ulong)(L->glref).ptr32;
            pcVar8 = *(char **)(uVar12 + 0x58);
            if (*(uint *)(uVar12 + 100) < uVar13) {
              MVar14 = 0x20;
              if (0x20 < uVar13) {
                MVar14 = uVar13;
              }
              pcVar8 = (char *)lj_mem_realloc(L,pcVar8,*(uint *)(uVar12 + 100),MVar14);
              *(char **)(uVar12 + 0x58) = pcVar8;
              *(MSize *)(uVar12 + 100) = MVar14;
            }
            sVar9 = fread(pcVar8 + uVar7,1,(ulong)(uVar13 - (int)uVar7),(FILE *)fp);
            uVar6 = (int)sVar9 + (int)uVar7;
            uVar7 = (ulong)uVar13;
            bVar16 = uVar6 == uVar13;
            uVar13 = uVar13 * 2;
          } while (bVar16);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,(ulong)uVar6);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x24) <= *(uint *)(uVar7 + 0x20)) {
            lj_gc_step(L);
          }
        }
      }
      else {
        if (0xfffeffff < uVar13) goto LAB_00145fc7;
        uVar4 = lj_lib_checkint(L,iVar5 + 1);
        if (uVar4 == 0) {
          iVar5 = getc((FILE *)fp);
          ungetc(iVar5,(FILE *)fp);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          (pTVar2->u32).lo = (L->glref).ptr32 + 0x80;
          (pTVar2->field_2).it = 0xfffffffb;
          bVar16 = iVar5 != -1;
        }
        else {
          uVar7 = (ulong)(L->glref).ptr32;
          pcVar8 = *(char **)(uVar7 + 0x58);
          if (*(uint *)(uVar7 + 100) < uVar4) {
            MVar14 = 0x20;
            if (0x20 < uVar4) {
              MVar14 = uVar4;
            }
            pcVar8 = (char *)lj_mem_realloc(L,pcVar8,*(uint *)(uVar7 + 100),MVar14);
            *(char **)(uVar7 + 0x58) = pcVar8;
            *(MSize *)(uVar7 + 100) = MVar14;
          }
          sVar9 = fread(pcVar8,1,(ulong)uVar4,(FILE *)fp);
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pGVar10 = lj_str_new(L,pcVar8,sVar9 & 0xffffffff);
          (pTVar2->u32).lo = (uint32_t)pGVar10;
          (pTVar2->field_2).it = 0xfffffffb;
          uVar7 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar7 + 0x24) <= *(uint *)(uVar7 + 0x20)) {
            lj_gc_step(L);
          }
          bVar16 = (sVar9 & 0xffffffff) != 0;
        }
        uVar4 = (uint)bVar16;
      }
      iVar11 = iVar11 + -1;
      uVar15 = uVar15 + 1;
    } while ((iVar11 != 0) && (uVar4 != 0));
  }
  iVar11 = ferror((FILE *)fp);
  if (iVar11 == 0) {
    if (uVar4 == 0) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
    }
    iVar11 = (int)uVar15 - start;
  }
  else {
    iVar11 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar11;
}

Assistant:

static int io_file_read(lua_State *L, FILE *fp, int start)
{
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] != '*')
	  lj_err_arg(L, n+1, LJ_ERR_INVOPT);
	if (p[1] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[1] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[1] == 'l'));
	else if (p[1] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}